

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestIO.h
# Opt level: O0

string * BuildRelativeInputPath(string *__return_storage_ptr__,char **argv,string *inRelativeURL)

{
  char *__s;
  allocator<char> local_61;
  string local_60;
  FileURL local_40;
  string *local_20;
  string *inRelativeURL_local;
  char **argv_local;
  
  __s = argv[1];
  local_20 = inRelativeURL;
  inRelativeURL_local = (string *)argv;
  argv_local = (char **)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
  LocalPathToFileURL(&local_40,&local_60);
  RelativeURLToLocalPath(__return_storage_ptr__,&local_40,local_20);
  FileURL::~FileURL(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

static string BuildRelativeInputPath(char* argv[], const string& inRelativeURL)
{
    return RelativeURLToLocalPath(LocalPathToFileURL(argv[1]), inRelativeURL);
}